

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

void secp256k1_scratch_apply_checkpoint
               (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t checkpoint)

{
  int iVar1;
  _func_void_char_ptr_void_ptr *in_RDX;
  secp256k1_callback *in_RSI;
  
  iVar1 = secp256k1_memcmp_var(in_RSI,"scratch",8);
  if (iVar1 == 0) {
    if (in_RSI[1].fn < in_RDX) {
      secp256k1_callback_call(in_RSI,(char *)in_RDX);
    }
    else {
      in_RSI[1].fn = in_RDX;
    }
  }
  else {
    secp256k1_callback_call(in_RSI,(char *)in_RDX);
  }
  return;
}

Assistant:

static void secp256k1_scratch_apply_checkpoint(const secp256k1_callback* error_callback, secp256k1_scratch* scratch, size_t checkpoint) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return;
    }
    if (checkpoint > scratch->alloc_size) {
        secp256k1_callback_call(error_callback, "invalid checkpoint");
        return;
    }
    scratch->alloc_size = checkpoint;
}